

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall
HdlcAnalyzer::ProcessInformationField
          (HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *information)

{
  U64 UVar1;
  const_reference pvVar2;
  uint uVar3;
  Frame frame;
  
  uVar3 = 0;
  while( true ) {
    if ((ulong)(((long)(information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl
                      .super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar3) break;
    pvVar2 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at(information,(ulong)uVar3);
    UVar1 = pvVar2->startSample;
    Frame::Frame(&frame);
    _frame = UVar1;
    std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
    Frame::~Frame(&frame);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessInformationField( const vector<HdlcByte>& information )
{
    for( U32 i = 0; i < information.size(); ++i )
    {
        HdlcByte byte = information.at( i );
        U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_INFORMATION, byte.startSample, byte.endSample, byte.value, i, flag );
        AddFrameToResults( frame );
    }
}